

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Convolution3DLayerParams::MergeFrom
          (Convolution3DLayerParams *this,Convolution3DLayerParams *from)

{
  bool bVar1;
  int32_t iVar2;
  Convolution3DLayerParams_PaddingType CVar3;
  LogMessage *other;
  WeightParams *pWVar4;
  WeightParams *pWVar5;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  Convolution3DLayerParams *local_18;
  Convolution3DLayerParams *from_local;
  Convolution3DLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x5ff2);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->outputshape_,&local_18->outputshape_);
  bVar1 = _internal_has_weights(local_18);
  if (bVar1) {
    pWVar4 = _internal_mutable_weights(this);
    pWVar5 = _internal_weights(local_18);
    WeightParams::MergeFrom(pWVar4,pWVar5);
  }
  bVar1 = _internal_has_bias(local_18);
  if (bVar1) {
    pWVar4 = _internal_mutable_bias(this);
    pWVar5 = _internal_bias(local_18);
    WeightParams::MergeFrom(pWVar4,pWVar5);
  }
  iVar2 = _internal_outputchannels(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_outputchannels(local_18);
    _internal_set_outputchannels(this,iVar2);
  }
  iVar2 = _internal_inputchannels(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_inputchannels(local_18);
    _internal_set_inputchannels(this,iVar2);
  }
  iVar2 = _internal_ngroups(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_ngroups(local_18);
    _internal_set_ngroups(this,iVar2);
  }
  iVar2 = _internal_kerneldepth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_kerneldepth(local_18);
    _internal_set_kerneldepth(this,iVar2);
  }
  iVar2 = _internal_kernelheight(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_kernelheight(local_18);
    _internal_set_kernelheight(this,iVar2);
  }
  iVar2 = _internal_kernelwidth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_kernelwidth(local_18);
    _internal_set_kernelwidth(this,iVar2);
  }
  iVar2 = _internal_stridedepth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_stridedepth(local_18);
    _internal_set_stridedepth(this,iVar2);
  }
  iVar2 = _internal_strideheight(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_strideheight(local_18);
    _internal_set_strideheight(this,iVar2);
  }
  iVar2 = _internal_stridewidth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_stridewidth(local_18);
    _internal_set_stridewidth(this,iVar2);
  }
  iVar2 = _internal_dilationdepth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_dilationdepth(local_18);
    _internal_set_dilationdepth(this,iVar2);
  }
  iVar2 = _internal_dilationheight(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_dilationheight(local_18);
    _internal_set_dilationheight(this,iVar2);
  }
  iVar2 = _internal_dilationwidth(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_dilationwidth(local_18);
    _internal_set_dilationwidth(this,iVar2);
  }
  bVar1 = _internal_hasbias(local_18);
  if (bVar1) {
    bVar1 = _internal_hasbias(local_18);
    _internal_set_hasbias(this,bVar1);
  }
  bVar1 = _internal_isdeconvolution(local_18);
  if (bVar1) {
    bVar1 = _internal_isdeconvolution(local_18);
    _internal_set_isdeconvolution(this,bVar1);
  }
  CVar3 = _internal_paddingtype(local_18);
  if (CVar3 != Convolution3DLayerParams_PaddingType_CUSTOM) {
    CVar3 = _internal_paddingtype(local_18);
    _internal_set_paddingtype(this,CVar3);
  }
  iVar2 = _internal_custompaddingfront(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingfront(local_18);
    _internal_set_custompaddingfront(this,iVar2);
  }
  iVar2 = _internal_custompaddingback(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingback(local_18);
    _internal_set_custompaddingback(this,iVar2);
  }
  iVar2 = _internal_custompaddingtop(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingtop(local_18);
    _internal_set_custompaddingtop(this,iVar2);
  }
  iVar2 = _internal_custompaddingbottom(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingbottom(local_18);
    _internal_set_custompaddingbottom(this,iVar2);
  }
  iVar2 = _internal_custompaddingleft(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingleft(local_18);
    _internal_set_custompaddingleft(this,iVar2);
  }
  iVar2 = _internal_custompaddingright(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_custompaddingright(local_18);
    _internal_set_custompaddingright(this,iVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Convolution3DLayerParams::MergeFrom(const Convolution3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Convolution3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  outputshape_.MergeFrom(from.outputshape_);
  if (from._internal_has_weights()) {
    _internal_mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_weights());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_bias());
  }
  if (from._internal_outputchannels() != 0) {
    _internal_set_outputchannels(from._internal_outputchannels());
  }
  if (from._internal_inputchannels() != 0) {
    _internal_set_inputchannels(from._internal_inputchannels());
  }
  if (from._internal_ngroups() != 0) {
    _internal_set_ngroups(from._internal_ngroups());
  }
  if (from._internal_kerneldepth() != 0) {
    _internal_set_kerneldepth(from._internal_kerneldepth());
  }
  if (from._internal_kernelheight() != 0) {
    _internal_set_kernelheight(from._internal_kernelheight());
  }
  if (from._internal_kernelwidth() != 0) {
    _internal_set_kernelwidth(from._internal_kernelwidth());
  }
  if (from._internal_stridedepth() != 0) {
    _internal_set_stridedepth(from._internal_stridedepth());
  }
  if (from._internal_strideheight() != 0) {
    _internal_set_strideheight(from._internal_strideheight());
  }
  if (from._internal_stridewidth() != 0) {
    _internal_set_stridewidth(from._internal_stridewidth());
  }
  if (from._internal_dilationdepth() != 0) {
    _internal_set_dilationdepth(from._internal_dilationdepth());
  }
  if (from._internal_dilationheight() != 0) {
    _internal_set_dilationheight(from._internal_dilationheight());
  }
  if (from._internal_dilationwidth() != 0) {
    _internal_set_dilationwidth(from._internal_dilationwidth());
  }
  if (from._internal_hasbias() != 0) {
    _internal_set_hasbias(from._internal_hasbias());
  }
  if (from._internal_isdeconvolution() != 0) {
    _internal_set_isdeconvolution(from._internal_isdeconvolution());
  }
  if (from._internal_paddingtype() != 0) {
    _internal_set_paddingtype(from._internal_paddingtype());
  }
  if (from._internal_custompaddingfront() != 0) {
    _internal_set_custompaddingfront(from._internal_custompaddingfront());
  }
  if (from._internal_custompaddingback() != 0) {
    _internal_set_custompaddingback(from._internal_custompaddingback());
  }
  if (from._internal_custompaddingtop() != 0) {
    _internal_set_custompaddingtop(from._internal_custompaddingtop());
  }
  if (from._internal_custompaddingbottom() != 0) {
    _internal_set_custompaddingbottom(from._internal_custompaddingbottom());
  }
  if (from._internal_custompaddingleft() != 0) {
    _internal_set_custompaddingleft(from._internal_custompaddingleft());
  }
  if (from._internal_custompaddingright() != 0) {
    _internal_set_custompaddingright(from._internal_custompaddingright());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}